

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.h
# Opt level: O2

void __thiscall chrono::ChBodyEasyBox::~ChBodyEasyBox(ChBodyEasyBox *this)

{
  ChBody::~ChBody(&this->super_ChBody,&PTR_construction_vtable_24__01153140);
  return;
}

Assistant:

class ChApi ChBodyEasyBox : public ChBody {
  public:
    /// Create a ChBody with optional box visualization and/or collision shape. The box is created centered at the
    /// center of mass. Mass and inertia are set automatically depending on density.
    ChBodyEasyBox(double Xsize,                                           ///< size along the X dimension
                  double Ysize,                                           ///< size along the Y dimension
                  double Zsize,                                           ///< size along the Z dimension
                  double density,                                         ///< density of the body
                  bool visualize = true,                                  ///< create visualization asset
                  bool collide = false,                                   ///< enable collision
                  std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                  std::shared_ptr<collision::ChCollisionModel> collision_model =
                      chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBody with a box visualization and collision shape using the specified collision model type. The box
    /// is created centered at the center of mass. Mass and inertia are set automatically depending on density.
    ChBodyEasyBox(double Xsize,                                    ///< size along the X dimension
                  double Ysize,                                    ///< size along the Y dimension
                  double Zsize,                                    ///< size along the Z dimension
                  double density,                                  ///< density of the body
                  std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                  collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(double Xsize,
                   double Ysize,
                   double Zsize,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);
};

/// Class for quick creation of rigid bodies with a convex hull shape.
/// In addition to the base class, this optionally sets the visualization and/or collision shape and automatically
/// calculates intertia properties based on the geometry.
class ChApi ChBodyEasyConvexHull : public ChBody {
  public:
    /// Create a ChBody with optional convex hull visualization and/or collision shape.
    /// The convex hull is defined with a set of points, expressed in a local frame.
    /// Mass and inertia are set automatically depending on density. The convex hull vertices are translated so that the
    /// barycenter coincides with the center of mass.
    ChBodyEasyConvexHull(std::vector<ChVector<>>& points,                        ///< points of the convex hull
                         double density,                                         ///< density of the body
                         bool visualize = true,                                  ///< create visualization asset
                         bool collide = false,                                   ///< enable collision
                         std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                         std::shared_ptr<collision::ChCollisionModel> collision_model =
                             chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBody with a convex hull visualization and collision shape using the specified collision model type.
    /// The convex hull is defined with a set of points, expressed in a local frame.
    /// Mass and inertia are set automatically depending on density. The convex hull vertices are translated so that the
    /// barycenter coincides with the center of mass.
    ChBodyEasyConvexHull(std::vector<ChVector<>>& points,                 ///< points of the convex hull
                         double density,                                  ///< density of the body
                         std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                         collision::ChCollisionSystemType collision_type  ///< collision model type
    );

    std::shared_ptr<geometry::ChTriangleMeshConnected> GetMesh() const { return m_mesh; }

  private:
    void SetupBody(std::vector<ChVector<>>& points,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);

    std::shared_ptr<geometry::ChTriangleMeshConnected> m_mesh;
};

/// Class for quick creation of rigid bodies with a convex hull shape, with a reference frame distinct from the
/// centroidal frame. In addition to the base class, this optionally sets the visualization and/or collision shape and
/// automatically calculates intertia properties based on the geometry.
class ChApi ChBodyEasyConvexHullAuxRef : public ChBodyAuxRef {
  public:
    /// Create a ChBodyAuxRef with optional convex hull visualization and/or collision shape. The convex hull is defined
    /// with a set of points, expressed in a local frame. Mass and inertia are set automatically depending on density.
    /// The center of mass is set at the barycenter.
    ChBodyEasyConvexHullAuxRef(std::vector<ChVector<>>& points,                        ///< convex hull points
                               double density,                                         ///< density of the body
                               bool visualize = true,                                  ///< create visualization asset
                               bool collide = false,                                   ///< enable collision
                               std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                               std::shared_ptr<collision::ChCollisionModel> collision_model =
                                   chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBodyAuxRef with a convex hull visualization and collision shape using the specified collision model
    /// type. The convex hull is defined with a set of points, expressed in a local frame. Mass and inertia are set
    /// automatically depending on density. The center of mass is set at the barycenter.
    ChBodyEasyConvexHullAuxRef(std::vector<ChVector<>>& points,                 ///< convex hull points
                               double density,                                  ///< density of the body
                               std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                               collision::ChCollisionSystemType collision_type  ///< collision model type
    );

    std::shared_ptr<geometry::ChTriangleMeshConnected> GetMesh() const { return m_mesh; }

  private:
    void SetupBody(std::vector<ChVector<>>& points,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);

    std::shared_ptr<geometry::ChTriangleMeshConnected> m_mesh;
};

/// Class for quick creation of rigid bodies with a mesh shape, with a reference frame distinct from the
/// centroidal frame. In addition to the base class, this optionally sets the visualization and/or collision shape and
/// automatically calculates intertia properties based on the geometry.
class ChApi ChBodyEasyMesh : public ChBodyAuxRef {
  public:
    /// Create a ChBodyAuxRef with optional mesh visualization and/or collision shape. The mesh is assumed to be
    /// provided in a Wavefront OBJ file and defined with respect to the body reference frame. Mass and inertia are set
    /// automatically depending on density.
    ChBodyEasyMesh(const std::string& filename,  ///< name of the Wavefront OBJ file
                   double density,               ///< density of the body
                   bool compute_mass = true,     ///< automatic evaluation of inertia properties
                   bool visualize = true,        ///< create visualization asset
                   bool collide = false,         ///< enable collision
                   std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                   double sphere_swept = 0.001,  ///< thickness (collision detection robustness)
                   std::shared_ptr<collision::ChCollisionModel> collision_model =
                       chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBodyAuxRef with optional mesh visualization and/or collision shape. The mesh is defined with respect
    /// to the body reference frame. Mass and inertia are set automatically depending on density.
    ChBodyEasyMesh(std::shared_ptr<geometry::ChTriangleMeshConnected> mesh,  ///< triangular mesh
                   double density,                                           ///< density of the body
                   bool compute_mass = true,  ///< automatic evaluation of inertia properties
                   bool visualize = true,     ///< create visualization asset
                   bool collide = false,      ///< enable collision
                   std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                   double sphere_swept = 0.001,  ///< thickness (collision detection robustness)
                   std::shared_ptr<collision::ChCollisionModel> collision_model =
                       chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBodyAuxRef with a mesh visualization and collision shape using the specified collision model type.
    /// The mesh is assumed to be provided in a Wavefront OBJ file and defined with respect to the body reference
    /// frame. Mass and inertia are set automatically depending on density.
    ChBodyEasyMesh(const std::string& filename,                     ///< name of the Wavefront OBJ file
                   double density,                                  ///< density of the body
                   std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                   double sphere_swept,                             ///< thickness (collision detection robustness)
                   collision::ChCollisionSystemType collision_type  ///< collision model type
    );

    /// Create a ChBodyAuxRef with a convex hull visualization and collision shape using the specified collision model
    /// type. The mesh is defined with respect to the body reference frame. Mass and inertia are set automatically
    /// depending on density.
    ChBodyEasyMesh(std::shared_ptr<geometry::ChTriangleMeshConnected> mesh,  ///< triangular mesh
                   double density,                                           ///< density of the body
                   std::shared_ptr<ChMaterialSurface> material,              ///< surface contact material
                   double sphere_swept,                             ///< thickness (collision detection robustness)
                   collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(std::shared_ptr<geometry::ChTriangleMeshConnected> trimesh,
                   const std::string& name,
                   double density,
                   bool compute_mass,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material,
                   double sphere_swept);
};

/// Class for quick creation of rigid bodies with a shape made of a cluster of spheres.
/// In addition to the base class, this optionally sets the visualization and/or collision shape and automatically
/// calculates intertia properties based on the geometry. Note that the mass and inertia are computed as if spheres are
/// not intersecting! If a more precise mass/inertia estimation is needed when spheres are intersecting, change mass and
/// inertia after creation using more advanced formulas.
class ChApi ChBodyEasyClusterOfSpheres : public ChBody {
  public:
    /// Create a ChBody with optional sphere cluster mesh visualization and/or collision shapes. The cluster of spheres
    /// will be displaced so that their center of mass corresponds to the origin of the ChBody. Mass and inertia are set
    /// automatically depending on density.
    ChBodyEasyClusterOfSpheres(std::vector<ChVector<>>& positions,                     ///< position of the spheres
                               std::vector<double>& radii,                             ///< sphere radius
                               double density,                                         ///< density of the body
                               bool visualize = true,                                  ///< create visualization asset
                               bool collide = false,                                   ///< enable collision
                               std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                               std::shared_ptr<collision::ChCollisionModel> collision_model =
                                   chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBody with a sphere cluster mesh visualization and collision shapes using the specified collision
    /// model type. The cluster of spheres will be displaced so that their center of mass corresponds to the origin of
    /// the ChBody. Mass and inertia are set automatically depending on density.
    ChBodyEasyClusterOfSpheres(std::vector<ChVector<>>& positions,              ///< position of the spheres
                               std::vector<double>& radii,                      ///< sphere radius
                               double density,                                  ///< density of the body
                               std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                               collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(std::vector<ChVector<>>& positions,
                   std::vector<double>& radii,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);
};

}